

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_DoublingFactorCounterTest_HalfFlush_Test::~TEST_DoublingFactorCounterTest_HalfFlush_Test
          (TEST_DoublingFactorCounterTest_HalfFlush_Test *this)

{
  TEST_DoublingFactorCounterTest_HalfFlush_Test *mem;
  TEST_DoublingFactorCounterTest_HalfFlush_Test *this_local;
  
  mem = this;
  ~TEST_DoublingFactorCounterTest_HalfFlush_Test(this);
  operator_delete(mem,(size_t)this);
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, HalfFlush)
{
	addPair(Tile::WhiteDragon);
	addTriplet(Tile::WestWind, false);
	addSequence(Tile::OneOfCharacters, false);
	addTriplet(Tile::FiveOfCharacters, false);
	addSequence(Tile::SixOfCharacters, false);

	s.winByDiscard();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::HalfFlush));
	CHECK_EQUAL(3, r.doubling_factor);
}